

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildDebugInfoManager(IRContext *this)

{
  Analysis AVar1;
  IRContext *local_20;
  unique_ptr<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_20 = this;
  local_10 = this;
  MakeUnique<spvtools::opt::analysis::DebugInfoManager,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  ::operator=(&this->debug_info_mgr_,&local_18);
  std::
  unique_ptr<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  ::~unique_ptr(&local_18);
  AVar1 = opt::operator|(this->valid_analyses_,kAnalysisDebugInfo);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildDebugInfoManager() {
    debug_info_mgr_ = MakeUnique<analysis::DebugInfoManager>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisDebugInfo;
  }